

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

VmaSuballocation *
VmaBinaryFindSorted<VmaSuballocationOffsetLess,VmaSuballocation_const*,VmaSuballocation>
          (VmaSuballocation **beg,VmaSuballocation **end,VmaSuballocation *value,
          VmaSuballocationOffsetLess *cmp)

{
  ulong uVar1;
  VmaSuballocation *pVVar2;
  VmaSuballocation *pVVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  pVVar3 = *beg;
  pVVar2 = *end;
  uVar4 = 0;
  uVar1 = (long)pVVar2 - (long)pVVar3 >> 5;
  while (uVar5 = uVar1, uVar4 <= uVar5 && uVar5 - uVar4 != 0) {
    uVar6 = uVar5 - uVar4 >> 1;
    uVar1 = uVar6 + uVar4;
    if (pVVar3[uVar1].offset < value->offset) {
      uVar4 = uVar4 + uVar6 + 1;
      uVar1 = uVar5;
    }
  }
  pVVar3 = pVVar3 + uVar4;
  if ((pVVar3 != pVVar2) && (value->offset != pVVar3->offset)) {
    pVVar3 = pVVar2;
  }
  return pVVar3;
}

Assistant:

IterT VmaBinaryFindSorted(const IterT& beg, const IterT& end, const KeyT& value, const CmpLess& cmp)
{
    IterT it = VmaBinaryFindFirstNotLess<CmpLess, IterT, KeyT>(
        beg, end, value, cmp);
    if (it == end ||
        (!cmp(*it, value) && !cmp(value, *it)))
    {
        return it;
    }
    return end;
}